

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_ReadSmallCordAfterBackUp_Test::
IoTest_ReadSmallCordAfterBackUp_Test(IoTest_ReadSmallCordAfterBackUp_Test *this)

{
  IoTest_ReadSmallCordAfterBackUp_Test *this_local;
  
  IoTest::IoTest(&this->super_IoTest);
  (this->super_IoTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IoTest_ReadSmallCordAfterBackUp_Test_02a1e780;
  return;
}

Assistant:

TEST_F(IoTest, ReadSmallCordAfterBackUp) {
  absl::Cord source;
  source.Append("foo bar");

  absl::Cord dest;
  CordInputStream input(&source);

  const void* buffer;
  int size;
  EXPECT_TRUE(input.Next(&buffer, &size));
  input.BackUp(size - 1);

  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  EXPECT_EQ(absl::Cord("oo ba"), dest);
}